

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildFloat32x4_4
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  OpCode opcode;
  RegOpnd *pRVar4;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *this_00;
  Instr *pIVar5;
  undefined4 *puVar6;
  
  pRVar4 = BuildSrcOpnd(this,src1RegSlot,TySimd128F4);
  src1 = BuildSrcOpnd(this,src2RegSlot,TySimd128F4);
  src1_00 = BuildSrcOpnd(this,src3RegSlot,TySimd128F4);
  this_00 = BuildDstOpnd(this,dstRegSlot,TySimd128F4);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x4000);
  IR::Opnd::SetValueType(&pRVar4->super_Opnd,(ValueType)0x4000);
  IR::Opnd::SetValueType(&src1->super_Opnd,(ValueType)0x4000);
  IR::Opnd::SetValueType(&src1_00->super_Opnd,(ValueType)0x4000);
  pIVar5 = AddExtendedArg(this,pRVar4,(RegOpnd *)0x0,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_004fcc2a;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_004fcc2a;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_00,pRVar4,offset);
  opcode = GetSimdOpcode(this,newOpcode);
  if (opcode != Simd128_Select_I4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xeff,"(opcode == Js::OpCode::Simd128_Select_I4)",
                       "Unexpected opcode for this format.");
    if (!bVar3) {
LAB_004fcc2a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pIVar5 = IR::Instr::New(opcode,&this_00->super_Opnd,pIVar5->m_dst,this->m_func);
  AddInstr(this,pIVar5,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildFloat32x4_4(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG4)
{
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128F4);
    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TySimd128F4);
    IR::RegOpnd * src3Opnd = BuildSrcOpnd(src3RegSlot, TySimd128F4);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128F4);

    IR::Instr * instr = nullptr;

    dstOpnd->SetValueType(ValueType::Simd);
    src1Opnd->SetValueType(ValueType::Simd);
    src2Opnd->SetValueType(ValueType::Simd);
    src3Opnd->SetValueType(ValueType::Simd);

    // Given bytecode: dst = op s1, s2, s3
    // Generate:
    // t1 = ExtendedArg_A s1
    // t2 = ExtendedArg_A s2, t1
    // t3 = ExtendedArg_A s3, t2
    // dst = op t3
    // Later phases will chain the arguments by following singleDefInstr of each use of ti.

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src3Opnd, instr->GetDst()->AsRegOpnd(), offset);

    Js::OpCode opcode = GetSimdOpcode(newOpcode);

    AssertMsg(opcode == Js::OpCode::Simd128_Select_I4, "Unexpected opcode for this format.");
    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}